

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_table.c
# Opt level: O1

void freeService(service_info *in)

{
  if (in != (service_info *)0x0) {
    if (in->serviceType != (char *)0x0) {
      ixmlFreeDOMString(in->serviceType);
    }
    if (in->serviceId != (char *)0x0) {
      ixmlFreeDOMString(in->serviceId);
    }
    if (in->SCPDURL != (char *)0x0) {
      free(in->SCPDURL);
    }
    if (in->controlURL != (char *)0x0) {
      free(in->controlURL);
    }
    if (in->eventURL != (char *)0x0) {
      free(in->eventURL);
    }
    if (in->UDN != (char *)0x0) {
      ixmlFreeDOMString(in->UDN);
    }
    if (in->subscriptionList != (subscription *)0x0) {
      freeSubscriptionList(in->subscriptionList);
    }
    in->TotalSubscriptions = 0;
    free(in);
    return;
  }
  return;
}

Assistant:

void freeService(service_info *in)
{
	if (in) {
		if (in->serviceType)
			ixmlFreeDOMString(in->serviceType);

		if (in->serviceId)
			ixmlFreeDOMString(in->serviceId);

		if (in->SCPDURL)
			free(in->SCPDURL);

		if (in->controlURL)
			free(in->controlURL);

		if (in->eventURL)
			free(in->eventURL);

		if (in->UDN)
			ixmlFreeDOMString(in->UDN);

		if (in->subscriptionList)
			freeSubscriptionList(in->subscriptionList);

		in->TotalSubscriptions = 0;
		free(in);
	}
}